

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<3,_0,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  MatrixCaseUtils local_104 [12];
  VecAccess<float,_4,_3> local_f8;
  Matrix<float,_4,_4> local_e0;
  Matrix<float,_4,_4> local_a0;
  Matrix<float,_4,_4> local_60;
  
  tcu::Matrix<float,_4,_4>::Matrix(&local_a0,(Matrix<float,_4,_4> *)s_constInMat4);
  tcu::Matrix<float,_4,_4>::Matrix(&local_e0,(Matrix<float,_4,_4> *)(s_constInMat4 + 0x40));
  tcu::operator/(&local_60,&local_a0,&local_e0);
  reduceToVec3(local_104,&local_60);
  local_f8.m_vector = &evalCtx->color;
  local_f8.m_index[0] = 0;
  local_f8.m_index[1] = 1;
  local_f8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_f8,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) / getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}